

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O0

ip4_flow_key om::net::ip4_flow_key::from_ip4_bytes(uchar *buf_)

{
  ip4_flow_key iVar1;
  uint8_t uVar2;
  undefined1 local_b0 [8];
  udp_header udp;
  tcp_header tcp;
  undefined1 local_48 [8];
  ip4_header ip;
  uchar *buf__local;
  ip4_flow_key flow_key;
  
  ip._ip = (ip *)buf_;
  ip4_flow_key((ip4_flow_key *)&buf__local);
  ip4_header::ip4_header((ip4_header *)local_48,(uchar *)ip._ip);
  buf__local._0_4_ = ip4_header::src_addr((ip4_header *)local_48);
  buf__local._4_4_ = ip4_header::src_addr((ip4_header *)local_48);
  uVar2 = ip4_header::proto((ip4_header *)local_48);
  flow_key._ip_dst._addr._0_1_ = uVar2;
  uVar2 = ip4_header::proto((ip4_header *)local_48);
  if (uVar2 == '\x06') {
    tcp_header::tcp_header((tcp_header *)&udp._udp,(uchar *)(ip._ip + 1));
    flow_key._ip_src._addr._0_2_ = tcp_header::src_port((tcp_header *)&udp._udp);
    flow_key._ip_src._addr._2_2_ = tcp_header::dest_port((tcp_header *)&udp._udp);
    tcp_header::~tcp_header((tcp_header *)&udp._udp);
  }
  else {
    uVar2 = ip4_header::proto((ip4_header *)local_48);
    if (uVar2 == '\x11') {
      udp_header::udp_header((udp_header *)local_b0,(uchar *)(ip._ip + 1));
      flow_key._ip_src._addr._0_2_ = udp_header::src_port((udp_header *)local_b0);
      flow_key._ip_src._addr._2_2_ = udp_header::dest_port((udp_header *)local_b0);
      udp_header::~udp_header((udp_header *)local_b0);
    }
  }
  ip4_header::~ip4_header((ip4_header *)local_48);
  iVar1._ip_dst._addr = buf__local._4_4_;
  iVar1._ip_src._addr = buf__local._0_4_;
  iVar1._tp_src = (uint16_t)flow_key._ip_src._addr;
  iVar1._tp_dst = flow_key._ip_src._addr._2_2_;
  iVar1._12_4_ = flow_key._ip_dst._addr;
  return iVar1;
}

Assistant:

static ip4_flow_key from_ip4_bytes(const unsigned char* buf_)
			{
				ip4_flow_key flow_key;
				ip4_header ip(buf_);

				flow_key._ip_src   = ip.src_addr();
				flow_key._ip_dst   = ip.src_addr();
				flow_key._ip_proto = ip.proto();

				if (ip.proto() == 6) {
					om::net::tcp_header tcp(buf_ + 20);
					flow_key._tp_src = tcp.src_port();
					flow_key._tp_dst = tcp.dest_port();
				} else if (ip.proto() == 17) {
					om::net::udp_header udp(buf_ + 20);
					flow_key._tp_src = udp.src_port();
					flow_key._tp_dst = udp.dest_port();
				}

				return flow_key;
			}